

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

void absl::lts_20250127::log_internal::SetMaxFramesInLogStackTrace(int max_num_frames)

{
  int max_num_frames_local;
  memory_order __b;
  
  std::operator&(memory_order_release,__memory_order_mask);
  (anonymous_namespace)::max_frames_in_stack_trace = max_num_frames;
  return;
}

Assistant:

void SetMaxFramesInLogStackTrace(int max_num_frames) {
  max_frames_in_stack_trace.store(max_num_frames, std::memory_order_release);
}